

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O3

void Abc_ObjSortInReverseOrder(Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Vec_Ptr_t *__ptr;
  long lVar2;
  
  __ptr = Abc_NtkDfsReverse(pNtk);
  iVar1 = __ptr->nSize;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      *(int *)((long)__ptr->pArray[lVar2] + 0x40) = (int)lVar2;
      lVar2 = lVar2 + 1;
      iVar1 = __ptr->nSize;
    } while (lVar2 < iVar1);
  }
  if (1 < (long)vNodes->nSize) {
    qsort(vNodes->pArray,(long)vNodes->nSize,8,Abc_ObjCompareByNumber);
    iVar1 = __ptr->nSize;
  }
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      *(undefined4 *)((long)__ptr->pArray[lVar2] + 0x40) = 0;
      lVar2 = lVar2 + 1;
    } while (lVar2 < __ptr->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_ObjSortInReverseOrder( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodes )
{
    Vec_Ptr_t * vOrder;
    Abc_Obj_t * pNode; 
    int i;
    vOrder = Abc_NtkDfsReverse( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pNode, i )
        pNode->iTemp = i;
    Vec_PtrSort( vNodes, (int (*)())Abc_ObjCompareByNumber );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pNode, i )
        pNode->iTemp = 0;
    Vec_PtrFree( vOrder );
}